

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
           *this,longdouble value)

{
  undefined8 *puVar1;
  iterator iVar2;
  basic_format_specs<char> local_40;
  undefined1 auStack_28 [8];
  longdouble value_local;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *this_local;
  
  _auStack_28 = value;
  unique0x1000008c = this;
  if (*(long *)(this + 0x10) == 0) {
    basic_format_specs<char>::basic_format_specs(&local_40,0,'\0',L' ');
  }
  else {
    puVar1 = *(undefined8 **)(this + 0x10);
    local_40.super_align_spec._0_8_ = *puVar1;
    local_40._8_8_ = puVar1[1];
    local_40.precision_ = *(int *)(puVar1 + 2);
    local_40.type_ = *(char *)((long)puVar1 + 0x14);
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_double<long_double>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             this,value,&local_40);
  iVar2 = arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
          out((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
               *)this);
  return (type)iVar2.container;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }